

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Message(string *m,char *title)

{
  ostream *poVar1;
  
  if (s_DisableMessages) {
    return;
  }
  if ((anonymous_namespace)::s_MessageCallback_abi_cxx11_._16_8_ != 0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
                  *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_,m,title);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)m);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Message(const std::string& m, const char* title)
{
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback) {
    s_MessageCallback(m, title);
    return;
  }
  std::cerr << m << std::endl << std::flush;
}